

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O3

void __thiscall cfd::core::CfdException::~CfdException(CfdException *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__CfdException_007db660;
  pcVar2 = (this->message_)._M_dataplus._M_p;
  paVar1 = &(this->message_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ::std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

_GLIBCXX_TXN_SAFE_DYN _GLIBCXX_USE_NOEXCEPT {
    // do nothing
  }